

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_decoder.h
# Opt level: O2

uint32_t __thiscall
draco::MeshEdgebreakerTraversalDecoder::DecodeSymbol(MeshEdgebreakerTraversalDecoder *this)

{
  uint uVar1;
  undefined8 in_RAX;
  uint32_t local_18;
  uint32_t symbol_suffix;
  
  _local_18 = in_RAX;
  DecoderBuffer::DecodeLeastSignificantBits32(&this->symbol_buffer_,1,&stack0xffffffffffffffe8);
  if (local_18 == 0) {
    uVar1 = 0;
  }
  else {
    DecoderBuffer::DecodeLeastSignificantBits32(&this->symbol_buffer_,2,&symbol_suffix);
    uVar1 = symbol_suffix * 2 | local_18;
  }
  return uVar1;
}

Assistant:

inline uint32_t DecodeSymbol() {
    uint32_t symbol;
    symbol_buffer_.DecodeLeastSignificantBits32(1, &symbol);
    if (symbol == TOPOLOGY_C) {
      return symbol;
    }
    // Else decode two additional bits.
    uint32_t symbol_suffix;
    symbol_buffer_.DecodeLeastSignificantBits32(2, &symbol_suffix);
    symbol |= (symbol_suffix << 1);
    return symbol;
  }